

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

int __thiscall DIntermissionScreenCast::Ticker(DIntermissionScreenCast *this)

{
  int *piVar1;
  FState *pFVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  PClassActor *pPVar6;
  AActor *pAVar7;
  FState *pFVar8;
  int iVar9;
  
  piVar1 = &(this->super_DIntermissionScreen).mTicker;
  *piVar1 = *piVar1 + 1;
  iVar9 = this->casttics;
  this->casttics = iVar9 + -1;
  pFVar8 = this->caststate;
  bVar3 = iVar9 < 2 || pFVar8 == (FState *)0x0;
  if ((bool)(~bVar3 & 1) || pFVar8 == (FState *)0x0) {
    return -(uint)bVar3;
  }
  iVar9 = (int)pFVar8->Tics;
  if (pFVar8->TicRange != 0) {
    uVar4 = FRandom::GenRand32(&FState::pr_statetics);
    iVar9 = iVar9 + uVar4 % (pFVar8->TicRange + 1);
  }
  if (iVar9 == -1) {
    return -1;
  }
  pFVar8 = this->caststate;
  pFVar2 = pFVar8->NextState;
  if (pFVar2 == (FState *)0x0) {
    return -1;
  }
  if ((pFVar2 == pFVar8) && (this->castdeath != false)) {
    return -1;
  }
  if (pFVar8 != this->advplayerstate) {
    this->caststate = pFVar2;
    PlayAttackSound(this);
    iVar9 = this->castframes + 1;
    this->castframes = iVar9;
    if ((iVar9 == 0xc) && (this->castdeath == false)) {
      this->castattacking = true;
      pPVar6 = this->mClass;
      if (pPVar6 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) {
LAB_00303230:
        pAVar7 = this->mDefaults;
LAB_00303234:
        pFVar8 = pAVar7->MissileState;
LAB_0030323b:
        this->caststate = pFVar8;
        this->basestate = pFVar8;
      }
      else {
        do {
          pPVar6 = (PClassActor *)(pPVar6->super_PClass).ParentClass;
          if (pPVar6 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) break;
        } while (pPVar6 != (PClassActor *)0x0);
        if (pPVar6 != (PClassActor *)0x0) goto LAB_00303230;
        uVar4 = this->castonmelee;
        pAVar7 = this->mDefaults;
        if (uVar4 == 0) {
          pFVar8 = pAVar7->MissileState;
          this->caststate = pFVar8;
          this->basestate = pFVar8;
          this->castonmelee = 1;
          if (pFVar8 != (FState *)0x0) goto LAB_00303249;
          pFVar8 = pAVar7->MeleeState;
          goto LAB_0030323b;
        }
        pFVar8 = pAVar7->MeleeState;
        this->caststate = pFVar8;
        this->basestate = pFVar8;
        this->castonmelee = uVar4 ^ 1;
        if (pFVar8 == (FState *)0x0) {
          if (uVar4 != 1) {
            pFVar8 = (FState *)0x0;
            goto LAB_0030323b;
          }
          goto LAB_00303234;
        }
      }
LAB_00303249:
      PlayAttackSound(this);
    }
    if (this->castattacking == false) {
      pFVar8 = this->caststate;
      goto LAB_003032a3;
    }
    if ((this->castframes != 0x18) &&
       (pFVar8 = this->caststate, pFVar8 != this->mDefaults->SeeState)) goto LAB_003032a3;
  }
  this->castattacking = false;
  this->castframes = 0;
  pFVar8 = this->mDefaults->SeeState;
  this->caststate = pFVar8;
LAB_003032a3:
  iVar9 = (int)pFVar8->Tics;
  if (pFVar8->TicRange != 0) {
    uVar4 = FRandom::GenRand32(&FState::pr_statetics);
    iVar9 = iVar9 + uVar4 % (pFVar8->TicRange + 1);
  }
  iVar5 = 0xf;
  if (iVar9 != -1) {
    iVar5 = iVar9;
  }
  this->casttics = iVar5;
  return 0;
}

Assistant:

int DIntermissionScreen::Ticker ()
{
	if (++mTicker >= mDuration && mDuration > 0) return -1;
	return 0;
}